

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int16_suite::fail_array8_int16_missing_two(void)

{
  value_type input [4];
  decoder decoder;
  undefined4 local_3c;
  value local_38;
  uchar local_34 [4];
  decoder local_30;
  
  local_34[0] = 0xaa;
  local_34[1] = '\x04';
  local_34[2] = '\x12';
  local_34[3] = '4';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[4]>(&local_30,&local_34);
  local_38 = local_30.current.code;
  local_3c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x700,"void compact_int16_suite::fail_array8_int16_missing_two()",&local_38,&local_3c)
  ;
  return;
}

Assistant:

void fail_array8_int16_missing_two()
{
    const value_type input[] = { token::code::array8_int16, 0x04, 0x12, 0x34 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}